

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O1

int RDL_pathsShareOnlyStart(uint r,uint y,uint z,RDL_graph *gra,RDL_sPathInfo *spi)

{
  size_t __size;
  uint *puVar1;
  ulong uVar2;
  void *__s;
  void *__s_00;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)z;
  uVar4 = (ulong)y;
  uVar2 = (ulong)r;
  uVar6 = (ulong)gra->V;
  __size = uVar6 * 4;
  __s = malloc(__size);
  __s_00 = malloc(__size);
  if (uVar6 != 0) {
    memset(__s,0,__size);
    memset(__s_00,0,__size);
  }
  *(undefined4 *)((long)__s + uVar4 * 4) = 1;
  *(undefined4 *)((long)__s_00 + uVar7 * 4) = 1;
  puVar1 = spi->pred[uVar2];
  do {
    uVar5 = puVar1[uVar4];
    uVar4 = (ulong)uVar5;
    *(undefined4 *)((long)__s + uVar4 * 4) = 1;
  } while (uVar5 != r);
  do {
    uVar5 = puVar1[uVar7];
    uVar7 = (ulong)uVar5;
    *(undefined4 *)((long)__s_00 + uVar7 * 4) = 1;
  } while (uVar5 != r);
  if (uVar6 == 0) {
    uVar5 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = 1;
    do {
      if (*(int *)((long)__s + uVar4 * 4 + -4) == 1) {
        uVar3 = uVar3 + (*(int *)((long)__s_00 + uVar4 * 4 + -4) == 1);
      }
    } while ((uVar4 < uVar6) && (uVar4 = uVar4 + 1, uVar3 < 2));
    uVar5 = 0;
    if ((uVar3 == 1) && (*(int *)((long)__s + uVar2 * 4) == 1)) {
      uVar5 = (uint)(*(int *)((long)__s_00 + uVar2 * 4) == 1);
    }
  }
  free(__s);
  free(__s_00);
  return uVar5;
}

Assistant:

static int RDL_pathsShareOnlyStart(unsigned r, unsigned y, unsigned z, RDL_graph *gra, RDL_sPathInfo *spi)
{
  unsigned result = 0, i, pnt, count=0;
  unsigned *vertInRY, *vertInRZ; /*edges in P(r,y) and P(r,z)*/
  vertInRY = malloc(gra->V * sizeof(*vertInRY));
  vertInRZ = malloc(gra->V * sizeof(*vertInRZ));

  for(i=0; i<gra->V; ++i)
  {
    vertInRY[i] = 0;
    vertInRZ[i] = 0;
  }
  vertInRY[y] = 1;
  vertInRZ[z] = 1;
  /*find out which vertices are on the path P(r,y)*/
  pnt = y;
  do
  {
    pnt = spi->pred[r][pnt];
    vertInRY[pnt] = 1;
  }while(pnt != r);
  /*find out which vertices are on the path P(r,z)*/
  pnt = z;
  do
  {
    pnt = spi->pred[r][pnt];
    vertInRZ[pnt] = 1;
  }while(pnt != r);
  /*find out if more than one vertex is shared by the paths*/
  for(i=0; i<gra->V && count<2; ++i)
  {
    if(vertInRY[i] == 1 && vertInRZ[i] == 1)
    {
      ++count;
    }
  }
  /*if r is the only shared vertex of the two paths return 1*/
  if(count == 1 && (vertInRY[r] == 1) && (vertInRZ[r] == 1))
  {
    result = 1;
  }

  free(vertInRY);
  free(vertInRZ);
  return result;
}